

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O0

bool QFileSystemEngine::renameFile
               (QFileSystemEntry *source,QFileSystemEntry *target,QSystemError *error)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  int *piVar5;
  QSystemError *in_RDX;
  long in_FS_OFFSET;
  int savedErrno;
  NativePath tgtPath;
  NativePath srcPath;
  QFileSystemEntry *in_stack_fffffffffffffee8;
  bool local_d1;
  QSystemError local_d0;
  QSystemError local_c8;
  QSystemError local_c0 [17];
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QFileSystemEntry::nativeFilePath(in_stack_fffffffffffffee8);
  local_38 = 0xaaaaaaaaaaaaaaaa;
  local_30 = 0xaaaaaaaaaaaaaaaa;
  local_28 = 0xaaaaaaaaaaaaaaaa;
  QFileSystemEntry::nativeFilePath(in_stack_fffffffffffffee8);
  bVar1 = QByteArray::isEmpty((QByteArray *)0x16e5c6);
  if (bVar1) {
    piVar5 = __errno_location();
    *piVar5 = 0x16;
    local_d1 = false;
  }
  else {
    bVar1 = qIsFilenameBroken((QByteArray *)0x16e629);
    if (bVar1) {
      piVar5 = __errno_location();
      *piVar5 = 0x16;
      local_d1 = false;
    }
    else {
      bVar1 = QByteArray::isEmpty((QByteArray *)0x16e692);
      if (bVar1) {
        piVar5 = __errno_location();
        *piVar5 = 0x16;
        local_d1 = false;
      }
      else {
        bVar1 = qIsFilenameBroken((QByteArray *)0x16e6f5);
        if (bVar1) {
          piVar5 = __errno_location();
          *piVar5 = 0x16;
          local_d1 = false;
        }
        else {
          pcVar3 = QByteArray::operator_cast_to_char_((QByteArray *)0x16e756);
          pcVar4 = QByteArray::operator_cast_to_char_((QByteArray *)0x16e768);
          iVar2 = renameat2(0xffffff9c,pcVar3,0xffffff9c,pcVar4,1);
          if (iVar2 == 0) {
            local_d1 = true;
          }
          else {
            piVar5 = __errno_location();
            if (*piVar5 == 0x16) {
              pcVar3 = QByteArray::operator_cast_to_char_((QByteArray *)0x16e7e5);
              pcVar4 = QByteArray::operator_cast_to_char_((QByteArray *)0x16e7f7);
              iVar2 = link(pcVar3,pcVar4);
              if (iVar2 == 0) {
                pcVar3 = QByteArray::operator_cast_to_char_((QByteArray *)0x16e816);
                iVar2 = unlink(pcVar3);
                if (iVar2 == 0) {
                  local_d1 = true;
                }
                else {
                  piVar5 = __errno_location();
                  iVar2 = *piVar5;
                  pcVar3 = QByteArray::operator_cast_to_char_((QByteArray *)0x16e84d);
                  unlink(pcVar3);
                  QSystemError::QSystemError(&local_c8,iVar2,StandardLibraryError);
                  *in_RDX = local_c8;
                  local_d1 = false;
                }
              }
              else {
                piVar5 = __errno_location();
                iVar2 = *piVar5;
                if ((((iVar2 != 2) && (iVar2 != 0xd)) && (1 < iVar2 - 0x11U)) &&
                   (((iVar2 != 0x14 && (iVar2 != 0x1e)) && (iVar2 != 0x24)))) {
                  pcVar3 = QByteArray::operator_cast_to_char_((QByteArray *)0x16e8e4);
                  pcVar4 = QByteArray::operator_cast_to_char_((QByteArray *)0x16e8f6);
                  iVar2 = rename(pcVar3,pcVar4);
                  if (iVar2 == 0) {
                    local_d1 = true;
                    goto LAB_0016e949;
                  }
                }
                piVar5 = __errno_location();
                QSystemError::QSystemError(&local_d0,*piVar5,StandardLibraryError);
                *in_RDX = local_d0;
                local_d1 = false;
              }
            }
            else {
              piVar5 = __errno_location();
              QSystemError::QSystemError(local_c0,*piVar5,StandardLibraryError);
              *in_RDX = local_c0[0];
              local_d1 = false;
            }
          }
        }
      }
    }
  }
LAB_0016e949:
  QByteArray::~QByteArray((QByteArray *)0x16e956);
  QByteArray::~QByteArray((QByteArray *)0x16e963);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_d1;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemEngine::renameFile(const QFileSystemEntry &source, const QFileSystemEntry &target, QSystemError &error)
{
    QFileSystemEntry::NativePath srcPath = source.nativeFilePath();
    QFileSystemEntry::NativePath tgtPath = target.nativeFilePath();

    Q_CHECK_FILE_NAME(srcPath, false);
    Q_CHECK_FILE_NAME(tgtPath, false);

#if defined(RENAME_NOREPLACE) && QT_CONFIG(renameat2)
    if (renameat2(AT_FDCWD, srcPath, AT_FDCWD, tgtPath, RENAME_NOREPLACE) == 0)
        return true;

    // We can also get EINVAL for some non-local filesystems.
    if (errno != EINVAL) {
        error = QSystemError(errno, QSystemError::StandardLibraryError);
        return false;
    }
#endif
#if defined(Q_OS_DARWIN) && defined(RENAME_EXCL)
    if (renameatx_np(AT_FDCWD, srcPath, AT_FDCWD, tgtPath, RENAME_EXCL) == 0)
        return true;
    if (errno != ENOTSUP) {
        error = QSystemError(errno, QSystemError::StandardLibraryError);
        return false;
    }
#endif

    if (SupportsHardlinking && ::link(srcPath, tgtPath) == 0) {
        if (::unlink(srcPath) == 0)
            return true;

        // if we managed to link but can't unlink the source, it's likely
        // it's in a directory we don't have write access to; fail the
        // renaming instead
        int savedErrno = errno;

        // this could fail too, but there's nothing we can do about it now
        ::unlink(tgtPath);

        error = QSystemError(savedErrno, QSystemError::StandardLibraryError);
        return false;
    } else if (!SupportsHardlinking) {
        // man 2 link on Linux has:
        // EPERM  The filesystem containing oldpath and newpath does not
        //        support the creation of hard links.
        errno = EPERM;
    }

    switch (errno) {
    case EACCES:
    case EEXIST:
    case ENAMETOOLONG:
    case ENOENT:
    case ENOTDIR:
    case EROFS:
    case EXDEV:
        // accept the error from link(2) (especially EEXIST) and don't retry
        break;

    default:
        // fall back to rename()
        // ### Race condition. If a file is moved in after this, it /will/ be
        // overwritten.
        if (::rename(srcPath, tgtPath) == 0)
            return true;
    }

    error = QSystemError(errno, QSystemError::StandardLibraryError);
    return false;
}